

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_reorder_fold.hpp
# Opt level: O1

uint32_t __thiscall
ans_reorder_fold_decode<2U>::decode_sym
          (ans_reorder_fold_decode<2U> *this,uint64_t *state,uint8_t **in_u8)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  pointer pdVar4;
  uint8_t *puVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar6 = this->frame_mask & *state;
  pdVar4 = (this->table).
           super__Vector_base<dec_entry_reorder_fold,_std::allocator<dec_entry_reorder_fold>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar7 = (ulong)pdVar4[uVar6].offset +
          (*state >> ((ulong)(byte)this->frame_log2 & 0x3f)) * (ulong)pdVar4[uVar6].freq;
  *state = uVar7;
  if (uVar7 < this->lower_bound) {
    puVar5 = *in_u8;
    *in_u8 = puVar5 + -4;
    *state = (ulong)*(uint *)(puVar5 + -4) | uVar7 << 0x20;
  }
  uVar1 = pdVar4[uVar6].mapped_num;
  uVar6 = (ulong)(uVar1 >> 0x1e);
  uVar2 = ans_fold_undo_mapping::except_mask._M_elems[uVar6];
  uVar3 = *(uint *)(*in_u8 + -uVar6);
  *in_u8 = *in_u8 + -uVar6;
  return ((uVar1 & 0x3fffffff) - 0x200) + (uVar2 & uVar3);
}

Assistant:

uint32_t decode_sym(uint64_t& state, const uint8_t*& in_u8)
    {
        const uint32_t radix = 8;
        const size_t thres = 1 << (fidelity + radix - 1);
        const auto& entry = table[state & frame_mask];
        state = uint64_t(entry.freq) * (state >> frame_log2)
            + uint64_t(entry.offset);
        if (state < lower_bound) {
            in_u8 -= sizeof(uint32_t);
            auto in_ptr_u32 = reinterpret_cast<const uint32_t*>(in_u8);
            state = state << constants::RADIX_LOG2 | uint64_t(*in_ptr_u32);
        }
        auto decoded_sym = ans_reorder_fold_undo_mapping(entry, in_u8);
        return decoded_sym - thres;
    }